

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O3

void fight_prog_horde_wolf(OBJ_DATA *obj,CHAR_DATA *ch)

{
  CHAR_DATA *victim;
  bool bVar1;
  int iVar2;
  int iVar3;
  AFFECT_DATA af;
  
  bVar1 = is_affected(ch,(int)gsn_rage);
  if ((bVar1) && (ch->fighting != (CHAR_DATA *)0x0)) {
    iVar2 = number_percent();
    iVar3 = get_skill(ch,(int)gsn_rage);
    if ((double)iVar2 <= (double)iVar3 * 0.18) {
      act("The spirit of the Wolf enrages you as you leap at $N and sink your fangs into $S throat!"
          ,ch,(void *)0x0,ch->fighting,3);
      act("$n gets a wild look in $s eyes and leaps at $N, sinking $s teeth into $S throat!",ch,
          (void *)0x0,ch->fighting,1);
      act("$n gets a wild look in $s eyes and leaps at you, sinking $s teeth into your throat!",ch,
          (void *)0x0,ch->fighting,2);
      victim = ch->fighting;
      iVar2 = dice((int)ch->level,2);
      damage_new(ch,victim,iVar2,-1,1,true,false,0,1,"bite");
      if (ch->fighting != (CHAR_DATA *)0x0) {
        bVar1 = is_affected(ch->fighting,(int)gsn_bleeding);
        if (!bVar1) {
          init_affect(&af);
          af.where = 0;
          af.type = gsn_bleeding;
          af.aftype = 5;
          af.location = 0;
          af.modifier = 0;
          af.level = ch->level + -5;
          af.duration = ch->level / 10;
          af.end_fun = (AFF_FUN *)0x0;
          af.owner = ch;
          new_affect_to_char(ch->fighting,&af);
        }
        bVar1 = is_affected(ch->fighting,(int)gsn_mangled);
        if (!bVar1) {
          iVar2 = number_percent();
          iVar3 = get_skill(ch,(int)gsn_rage);
          if ((double)iVar2 < (double)iVar3 * 0.28) {
            init_affect(&af);
            af.where = 0;
            af.type = gsn_mangled;
            af.aftype = 3;
            af.location = 0;
            af.modifier = 0;
            af.level = ch->level + -5;
            af.duration = ch->level / 0x12;
            af.end_fun = (AFF_FUN *)0x0;
            af.owner = ch;
            new_affect_to_char(ch->fighting,&af);
            act("You hear the satisfying crunch of bone as you tear deeply into $N\'s throat.",ch,
                (void *)0x0,ch->fighting,3);
            act("You hear the crunch of bone as $n tears deeply into your throat.",ch,(void *)0x0,
                ch->fighting,2);
            act("You hear the crunch of bone as $n tears deeply into $N\'s throat.",ch,(void *)0x0,
                ch->fighting,1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void fight_prog_horde_wolf(OBJ_DATA *obj, CHAR_DATA *ch)
{
	AFFECT_DATA af;

	if (!is_affected(ch, gsn_rage) || !ch->fighting || number_percent() > (.18 * get_skill(ch, gsn_rage)))
		return;

	act("The spirit of the Wolf enrages you as you leap at $N and sink your fangs into $S throat!", ch, 0, ch->fighting, TO_CHAR);
	act("$n gets a wild look in $s eyes and leaps at $N, sinking $s teeth into $S throat!", ch, 0, ch->fighting, TO_NOTVICT);
	act("$n gets a wild look in $s eyes and leaps at you, sinking $s teeth into your throat!", ch, 0, ch->fighting, TO_VICT);
	damage_new(ch, ch->fighting, dice(ch->level, 2), TYPE_UNDEFINED, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "bite");

	if (!ch->fighting)
		return;

	if (!is_affected(ch->fighting, gsn_bleeding))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_bleeding;
		af.aftype = AFT_INVIS;
		af.location = APPLY_NONE;
		af.modifier = 0;
		af.level = ch->level - 5;
		af.duration = ch->level / 10;
		af.owner = ch;
		af.end_fun = nullptr;
		new_affect_to_char(ch->fighting, &af);
	}

	if (!is_affected(ch->fighting, gsn_mangled) && number_percent() < (get_skill(ch, gsn_rage) * .28))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_mangled;
		af.aftype = AFT_MALADY;
		af.location = APPLY_NONE;
		af.modifier = 0;
		af.level = ch->level - 5;
		af.duration = ch->level / 18;
		af.owner = ch;
		af.end_fun = nullptr;
		new_affect_to_char(ch->fighting, &af);

		act("You hear the satisfying crunch of bone as you tear deeply into $N's throat.", ch, 0, ch->fighting, TO_CHAR);
		act("You hear the crunch of bone as $n tears deeply into your throat.", ch, 0, ch->fighting, TO_VICT);
		act("You hear the crunch of bone as $n tears deeply into $N's throat.", ch, 0, ch->fighting, TO_NOTVICT);
	}
}